

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeExtractSampleLists.cpp
# Opt level: O1

void writeSampleList(char *casePath,int listNdx,SampleList *sampleList)

{
  Item *pIVar1;
  _func_int *p_Var2;
  long *plVar3;
  undefined8 *puVar4;
  pointer ppIVar5;
  _func_int **pp_Var6;
  runtime_error *this;
  ulong *puVar7;
  size_type *psVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  string filename;
  ofstream out;
  allocator<char> local_2d9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  ulong *local_2b8;
  long local_2b0;
  ulong local_2a8;
  long lStack_2a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  ulong *local_278;
  long local_270;
  ulong local_268 [2];
  SampleList *local_258;
  long *local_250 [2];
  long local_240 [2];
  long local_230;
  filebuf local_228 [24];
  int aiStack_210 [20];
  ios_base local_1c0 [136];
  ios_base local_138 [264];
  
  std::__cxx11::string::string<std::allocator<char>>((string *)local_250,casePath,&local_2d9);
  plVar3 = (long *)std::__cxx11::string::append((char *)local_250);
  puVar7 = (ulong *)(plVar3 + 2);
  if ((ulong *)*plVar3 == puVar7) {
    local_2a8 = *puVar7;
    lStack_2a0 = plVar3[3];
    local_2b8 = &local_2a8;
  }
  else {
    local_2a8 = *puVar7;
    local_2b8 = (ulong *)*plVar3;
  }
  local_2b0 = plVar3[1];
  *plVar3 = (long)puVar7;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_230);
  std::ostream::operator<<((ostream *)&local_230,listNdx);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_230);
  std::ios_base::~ios_base(local_1c0);
  uVar10 = 0xf;
  if (local_2b8 != &local_2a8) {
    uVar10 = local_2a8;
  }
  if (uVar10 < (ulong)(local_270 + local_2b0)) {
    uVar10 = 0xf;
    if (local_278 != local_268) {
      uVar10 = local_268[0];
    }
    if ((ulong)(local_270 + local_2b0) <= uVar10) {
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_278,0,(char *)0x0,(ulong)local_2b8);
      goto LAB_0010c7f6;
    }
  }
  puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_2b8,(ulong)local_278);
LAB_0010c7f6:
  local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
  psVar8 = puVar4 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar8) {
    local_2d8.field_2._M_allocated_capacity = *psVar8;
    local_2d8.field_2._8_8_ = puVar4[3];
  }
  else {
    local_2d8.field_2._M_allocated_capacity = *psVar8;
    local_2d8._M_dataplus._M_p = (pointer)*puVar4;
  }
  local_2d8._M_string_length = puVar4[1];
  *puVar4 = psVar8;
  puVar4[1] = 0;
  *(undefined1 *)psVar8 = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_2d8);
  local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
  psVar8 = (size_type *)(plVar3 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar8) {
    local_298.field_2._M_allocated_capacity = *psVar8;
    local_298.field_2._8_8_ = plVar3[3];
  }
  else {
    local_298.field_2._M_allocated_capacity = *psVar8;
    local_298._M_dataplus._M_p = (pointer)*plVar3;
  }
  local_298._M_string_length = plVar3[1];
  *plVar3 = (long)psVar8;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
    operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
  }
  if (local_278 != local_268) {
    operator_delete(local_278,local_268[0] + 1);
  }
  if (local_2b8 != &local_2a8) {
    operator_delete(local_2b8,local_2a8 + 1);
  }
  if (local_250[0] != local_240) {
    operator_delete(local_250[0],local_240[0] + 1);
  }
  std::ofstream::ofstream(&local_230,local_298._M_dataplus._M_p,_S_bin);
  if (*(int *)((long)aiStack_210 + *(long *)(local_230 + -0x18)) == 0) {
    if (0 < (int)((ulong)((long)(sampleList->sampleInfo).valueInfos.m_items.
                                super__Vector_base<xe::ri::Item_*,_std::allocator<xe::ri::Item_*>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)(sampleList->sampleInfo).valueInfos.m_items.
                               super__Vector_base<xe::ri::Item_*,_std::allocator<xe::ri::Item_*>_>.
                               _M_impl.super__Vector_impl_data._M_start) >> 3)) {
      lVar11 = 0;
      do {
        if (lVar11 != 0) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,",",1);
        }
        pIVar1 = (sampleList->sampleInfo).valueInfos.m_items.
                 super__Vector_base<xe::ri::Item_*,_std::allocator<xe::ri::Item_*>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar11];
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_230,(char *)pIVar1[1]._vptr_Item,*(long *)&pIVar1[1].m_type);
        lVar11 = lVar11 + 1;
      } while (lVar11 < (int)((ulong)((long)(sampleList->sampleInfo).valueInfos.m_items.
                                            super__Vector_base<xe::ri::Item_*,_std::allocator<xe::ri::Item_*>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)(sampleList->sampleInfo).valueInfos.m_items.
                                           super__Vector_base<xe::ri::Item_*,_std::allocator<xe::ri::Item_*>_>
                                           ._M_impl.super__Vector_impl_data._M_start) >> 3));
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"\n",1);
    ppIVar5 = (sampleList->samples).m_items.
              super__Vector_base<xe::ri::Item_*,_std::allocator<xe::ri::Item_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (0 < (int)((ulong)((long)(sampleList->samples).m_items.
                                super__Vector_base<xe::ri::Item_*,_std::allocator<xe::ri::Item_*>_>.
                                _M_impl.super__Vector_impl_data._M_finish - (long)ppIVar5) >> 3)) {
      lVar11 = 0;
      local_258 = sampleList;
      do {
        pIVar1 = ppIVar5[lVar11];
        pp_Var6 = pIVar1[1]._vptr_Item;
        if (0 < (int)((ulong)(*(long *)&pIVar1[1].m_type - (long)pp_Var6) >> 3)) {
          lVar9 = 0;
          do {
            p_Var2 = pp_Var6[lVar9];
            if (lVar9 != 0) {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,",",1);
            }
            xe::ri::operator<<((ostream *)&local_230,(NumericValue *)(p_Var2 + 0x10));
            lVar9 = lVar9 + 1;
            pp_Var6 = pIVar1[1]._vptr_Item;
          } while (lVar9 < (int)((ulong)(*(long *)&pIVar1[1].m_type - (long)pp_Var6) >> 3));
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"\n",1);
        lVar11 = lVar11 + 1;
        ppIVar5 = (local_258->samples).m_items.
                  super__Vector_base<xe::ri::Item_*,_std::allocator<xe::ri::Item_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
      } while (lVar11 < (int)((ulong)((long)(local_258->samples).m_items.
                                            super__Vector_base<xe::ri::Item_*,_std::allocator<xe::ri::Item_*>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)ppIVar5) >> 3));
    }
    local_230 = _VTT;
    *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = __filebuf;
    std::filebuf::~filebuf(local_228);
    std::ios_base::~ios_base(local_138);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298._M_dataplus._M_p != &local_298.field_2) {
      operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
    }
    return;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_2d8,"Failed to open ",&local_298);
  std::runtime_error::runtime_error(this,(string *)&local_2d8);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void writeSampleList (const char* casePath, int listNdx, const xe::ri::SampleList& sampleList)
{
	const string	filename	= string(casePath) + "." + de::toString(listNdx) + ".csv";
	std::ofstream	out			(filename.c_str(), std::ios_base::binary);

	if (!out.good())
		throw std::runtime_error("Failed to open " + filename);

	// Header
	for (int ndx = 0; ndx < sampleList.sampleInfo.valueInfos.getNumItems(); ndx++)
	{
		if (ndx != 0)
			out << ",";
		out << static_cast<const xe::ri::ValueInfo&>(sampleList.sampleInfo.valueInfos.getItem(ndx)).name;
	}
	out << "\n";

	// Samples
	for (int sampleNdx = 0; sampleNdx < sampleList.samples.getNumItems(); sampleNdx++)
	{
		const xe::ri::Sample&	sample	= static_cast<const xe::ri::Sample&>(sampleList.samples.getItem(sampleNdx));

		for (int valNdx = 0; valNdx < sample.values.getNumItems(); valNdx++)
		{
			const xe::ri::SampleValue&	value	= static_cast<const xe::ri::SampleValue&>(sample.values.getItem(valNdx));

			if (valNdx != 0)
				out << ",";

			out << value.value;
		}
		out << "\n";
	}
}